

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CGL::Application::mouse1_dragged(Application *this,float x,float y)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  ostream *poVar5;
  void *this_00;
  long in_RDI;
  float in_XMM0_Da;
  float fVar6;
  float fVar7;
  float in_XMM1_Da;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Application *in_stack_00000018;
  float dy;
  float dx;
  undefined4 in_stack_ffffffffffffff10;
  float fVar10;
  float fVar11;
  float local_c4;
  float local_b4;
  Vector2D local_20 [2];
  
  if (*(int *)(in_RDI + 0x18) == 1) {
    local_b4 = (float)*(ulong *)(in_RDI + 0x2b8);
    Vector2D::Vector2D(local_20,(double)in_XMM0_Da,(double)(local_b4 - in_XMM1_Da));
    lVar1 = *(long *)(in_RDI + 0x28);
    *(double *)(lVar1 + 0x18) = local_20[0].x;
    *(double *)(lVar1 + 0x20) = local_20[0].y;
  }
  else {
    fVar6 = in_XMM0_Da - *(float *)(in_RDI + 0x378);
    fVar10 = in_XMM1_Da - *(float *)(in_RDI + 0x37c);
    poVar5 = std::operator<<((ostream *)&std::cout,"dx, dy: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,fVar6);
    poVar5 = std::operator<<(poVar5,", ");
    this_00 = (void *)std::ostream::operator<<(poVar5,fVar10);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    if ((*(int *)(in_RDI + 0x18) == 0) &&
       (bVar4 = GLScene::Scene::has_selection(*(Scene **)(in_RDI + 0x20)), bVar4)) {
      local_c4 = (float)*(ulong *)(in_RDI + 0x2b0);
      local_c4 = (fVar6 + fVar6) / local_c4;
      fVar10 = -fVar10 - fVar10;
      fVar6 = (float)(long)*(ulong *)(in_RDI + 0x2b8);
      fVar11 = (float)*(ulong *)(in_RDI + 0x2b8);
      fVar7 = fVar10 / fVar11;
      get_world_to_3DH(in_stack_00000018);
      GLScene::Scene::drag_selection
                ((Scene *)CONCAT44(fVar11,fVar6),fVar10,local_c4,
                 (Matrix4x4 *)CONCAT44(fVar7,in_stack_ffffffffffffff10));
    }
    else {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(ulong *)(in_RDI + 0x2b8);
      auVar8 = vpunpckldq_avx(auVar8,_DAT_002b5be0);
      auVar2 = vsubpd_avx(auVar8,_DAT_002b5bf0);
      auVar3 = vpermilpd_avx(auVar2,1);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(ulong *)(in_RDI + 0x2b0);
      auVar8 = vpunpckldq_avx(auVar9,_DAT_002b5be0);
      auVar8 = vsubpd_avx(auVar8,_DAT_002b5bf0);
      auVar9 = vpermilpd_avx(auVar8,1);
      CGL::Camera::rotate_by
                ((double)fVar10 * (-3.141592653589793 / (auVar3._0_8_ + auVar2._0_8_)),
                 (double)-fVar6 * (3.141592653589793 / (auVar9._0_8_ + auVar8._0_8_)));
    }
  }
  return;
}

Assistant:

void Application::mouse1_dragged(float x, float y) {
  if (mode == RENDER_MODE) {
    renderer->cell_br = Vector2D(x, screenH - y);
    return;
  }
  float dx = (x - mouseX);
  float dy = (y - mouseY);

  cout << "dx, dy: " << dx << ", " << dy << endl;

  if (mode == EDIT_MODE && scene->has_selection()) {
    scene->drag_selection(2 * dx / screenW, 2 * -dy / screenH,
                          get_world_to_3DH());
  } else {
    camera.rotate_by(-dy * (PI / screenH), -dx * (PI / screenW));
  }
}